

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeIndirectComputeDispatchTests.cpp
# Opt level: O0

void __thiscall
vkt::compute::anon_unknown_1::IndirectDispatchCaseBufferGenerate::initPrograms
          (IndirectDispatchCaseBufferGenerate *this,SourceCollections *programCollection)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  ostream *poVar4;
  pointer pDVar5;
  ProgramSources *this_00;
  ShaderSource local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  undefined1 local_1e0 [8];
  string computeString;
  const_iterator cStack_1b8;
  deUint32 offs;
  __normal_iterator<const_vkt::compute::(anonymous_namespace)::DispatchCommand_*,_std::vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>_>
  local_1b0;
  const_iterator cmdIter;
  ostringstream local_198 [8];
  ostringstream computeBuffer;
  char *versionDecl;
  SourceCollections *programCollection_local;
  IndirectDispatchCaseBufferGenerate *this_local;
  
  IndirectDispatchCaseBufferUpload::initPrograms
            (&this->super_IndirectDispatchCaseBufferUpload,programCollection);
  pcVar3 = glu::getGLSLVersionDeclaration
                     ((this->super_IndirectDispatchCaseBufferUpload).m_glslVersion);
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar4 = std::operator<<((ostream *)local_198,pcVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,
                           "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n");
  poVar4 = std::operator<<(poVar4,"layout(set = 0, binding = 0, std430) buffer Out\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  poVar4 = std::operator<<(poVar4,"\thighp uint data[];\n");
  poVar4 = std::operator<<(poVar4,"};\n");
  poVar4 = std::operator<<(poVar4,"void writeCmd (uint offset, uvec3 numWorkGroups)\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  poVar4 = std::operator<<(poVar4,"\tdata[offset+0u] = numWorkGroups.x;\n");
  poVar4 = std::operator<<(poVar4,"\tdata[offset+1u] = numWorkGroups.y;\n");
  poVar4 = std::operator<<(poVar4,"\tdata[offset+2u] = numWorkGroups.z;\n");
  poVar4 = std::operator<<(poVar4,"}\n");
  poVar4 = std::operator<<(poVar4,"void main (void)\n");
  std::operator<<(poVar4,"{\n");
  local_1b0._M_current =
       (DispatchCommand *)
       std::
       vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
       ::begin(&(this->super_IndirectDispatchCaseBufferUpload).m_dispatchCommands);
  while( true ) {
    cStack_1b8 = std::
                 vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                 ::end(&(this->super_IndirectDispatchCaseBufferUpload).m_dispatchCommands);
    bVar1 = __gnu_cxx::operator!=(&local_1b0,&stack0xfffffffffffffe48);
    if (!bVar1) break;
    pDVar5 = __gnu_cxx::
             __normal_iterator<const_vkt::compute::(anonymous_namespace)::DispatchCommand_*,_std::vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>_>
             ::operator->(&local_1b0);
    computeString.field_2._12_4_ = (undefined4)((ulong)pDVar5->m_offset >> 2);
    poVar4 = std::operator<<((ostream *)local_198,"\twriteCmd(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,computeString.field_2._12_4_);
    poVar4 = std::operator<<(poVar4,"u, uvec3(");
    pDVar5 = __gnu_cxx::
             __normal_iterator<const_vkt::compute::(anonymous_namespace)::DispatchCommand_*,_std::vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>_>
             ::operator->(&local_1b0);
    uVar2 = tcu::Vector<unsigned_int,_3>::x(&pDVar5->m_numWorkGroups);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
    poVar4 = std::operator<<(poVar4,"u, ");
    pDVar5 = __gnu_cxx::
             __normal_iterator<const_vkt::compute::(anonymous_namespace)::DispatchCommand_*,_std::vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>_>
             ::operator->(&local_1b0);
    uVar2 = tcu::Vector<unsigned_int,_3>::y(&pDVar5->m_numWorkGroups);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
    poVar4 = std::operator<<(poVar4,"u, ");
    pDVar5 = __gnu_cxx::
             __normal_iterator<const_vkt::compute::(anonymous_namespace)::DispatchCommand_*,_std::vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>_>
             ::operator->(&local_1b0);
    uVar2 = tcu::Vector<unsigned_int,_3>::z(&pDVar5->m_numWorkGroups);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
    std::operator<<(poVar4,"u));\n");
    __gnu_cxx::
    __normal_iterator<const_vkt::compute::(anonymous_namespace)::DispatchCommand_*,_std::vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>_>
    ::operator++(&local_1b0);
  }
  std::operator<<((ostream *)local_198,"}\n");
  std::__cxx11::ostringstream::str();
  std::operator+(&local_220,"indirect_dispatch_",
                 &(this->super_IndirectDispatchCaseBufferUpload).super_TestCase.super_TestCase.
                  super_TestNode.m_name);
  std::operator+(&local_200,&local_220,"_generate");
  this_00 = ::vk::ProgramCollection<glu::ProgramSources>::add
                      (&programCollection->glslSources,&local_200);
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_248,(string *)local_1e0);
  glu::ProgramSources::operator<<(this_00,&local_248);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_248);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)local_1e0);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void IndirectDispatchCaseBufferGenerate::initPrograms (vk::SourceCollections& programCollection) const
{
	IndirectDispatchCaseBufferUpload::initPrograms(programCollection);

	const char* const	versionDecl = glu::getGLSLVersionDeclaration(m_glslVersion);

	std::ostringstream computeBuffer;

	// Header
	computeBuffer
		<< versionDecl << "\n"
		<< "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
		<< "layout(set = 0, binding = 0, std430) buffer Out\n"
		<< "{\n"
		<< "	highp uint data[];\n"
		<< "};\n"
		<< "void writeCmd (uint offset, uvec3 numWorkGroups)\n"
		<< "{\n"
		<< "	data[offset+0u] = numWorkGroups.x;\n"
		<< "	data[offset+1u] = numWorkGroups.y;\n"
		<< "	data[offset+2u] = numWorkGroups.z;\n"
		<< "}\n"
		<< "void main (void)\n"
		<< "{\n";

	// Dispatch commands
	for (DispatchCommandsVec::const_iterator cmdIter = m_dispatchCommands.begin(); cmdIter != m_dispatchCommands.end(); ++cmdIter)
	{
		const deUint32 offs = (deUint32)(cmdIter->m_offset / sizeof(deUint32));
		DE_ASSERT((size_t)offs * sizeof(deUint32) == (size_t)cmdIter->m_offset);

		computeBuffer
			<< "\twriteCmd(" << offs << "u, uvec3("
			<< cmdIter->m_numWorkGroups.x() << "u, "
			<< cmdIter->m_numWorkGroups.y() << "u, "
			<< cmdIter->m_numWorkGroups.z() << "u));\n";
	}

	// Ending
	computeBuffer << "}\n";

	std::string computeString = computeBuffer.str();

	programCollection.glslSources.add("indirect_dispatch_" + m_name + "_generate") << glu::ComputeSource(computeString);
}